

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void VR4_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  ushort uVar6;
  ulong uVar7;
  uint uVar8;
  long in_RSI;
  long in_RDI;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 auVar10 [16];
  __m128i efgh;
  __m128i avg2;
  __m128i lsb;
  __m128i avg1;
  __m128i IXABCD;
  __m128i _XABCD;
  __m128i abcd;
  __m128i ABCD0;
  __m128i XABCD;
  int X;
  int K;
  int J;
  int I;
  __m128i one;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  
  uVar8 = (uint)*(byte *)(in_RSI + -2);
  bVar2 = *(byte *)(in_RSI + -3);
  bVar3 = *(byte *)(in_RSI + -4);
  bVar4 = *(byte *)(in_RSI + -1);
  uVar6 = *(ushort *)(in_RSI + -2);
  uVar1 = *(ulong *)(in_RSI + -1);
  local_78 = (undefined1)uVar1;
  uStack_77 = (undefined1)(uVar1 >> 8);
  uStack_76 = (undefined1)(uVar1 >> 0x10);
  uStack_75 = (undefined1)(uVar1 >> 0x18);
  uStack_74 = (undefined1)(uVar1 >> 0x20);
  uStack_73 = (undefined1)(uVar1 >> 0x28);
  uStack_72 = (undefined1)(uVar1 >> 0x30);
  uStack_71 = (undefined1)(uVar1 >> 0x38);
  pavgb(local_78,uStack_77);
  pavgb(uStack_77,uStack_76);
  pavgb(uStack_76,uStack_75);
  pavgb(uStack_75,uStack_74);
  pavgb(uStack_74,uStack_73);
  pavgb(uStack_73,uStack_72);
  pavgb(uStack_72,uStack_71);
  pavgb(uStack_71,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  uVar7 = uVar1 & 0xffffffffffff00;
  local_98 = (undefined1)uVar6;
  uStack_97 = (undefined1)(uVar6 >> 8);
  uStack_96 = (undefined1)(uVar7 >> 8);
  uStack_95 = (undefined1)(uVar7 >> 0x10);
  uStack_94 = (undefined1)(uVar7 >> 0x18);
  uStack_93 = (undefined1)(uVar7 >> 0x20);
  uStack_92 = (undefined1)(uVar7 >> 0x28);
  uStack_91 = (undefined1)(uVar7 >> 0x30);
  uVar9 = pavgb(local_98,uStack_77);
  uVar11 = pavgb(uStack_97,uStack_76);
  uVar12 = pavgb(uStack_96,uStack_75);
  uVar13 = pavgb(uStack_95,uStack_74);
  uVar14 = pavgb(uStack_94,uStack_73);
  uVar15 = pavgb(uStack_93,uStack_72);
  uVar16 = pavgb(uStack_92,uStack_71);
  uVar17 = pavgb(uStack_91,0);
  uVar18 = pavgb(uStack_71,0);
  uVar19 = pavgb(0,0);
  uVar20 = pavgb(0,0);
  uVar21 = pavgb(0,0);
  uVar22 = pavgb(0,0);
  uVar23 = pavgb(0,0);
  uVar24 = pavgb(0,0);
  uVar25 = pavgb(0,0);
  auVar5[1] = uVar11;
  auVar5[0] = uVar9;
  auVar5[2] = uVar12;
  auVar5[3] = uVar13;
  auVar5[4] = uVar14;
  auVar5[5] = uVar15;
  auVar5[6] = uVar16;
  auVar5[7] = uVar17;
  auVar5[9] = uVar19;
  auVar5[8] = uVar18;
  auVar5[10] = uVar20;
  auVar5[0xb] = uVar21;
  auVar5[0xc] = uVar22;
  auVar5[0xd] = uVar23;
  auVar5[0xe] = uVar24;
  auVar5[0xf] = uVar25;
  auVar10._8_8_ = uVar1 >> 0x38 & 0x1010101010101;
  auVar10._0_8_ = ((uVar7 << 8 | (ulong)uVar6) ^ uVar1 >> 8) & 0x101010101010101;
  auVar10 = psubusb(auVar5,auVar10);
  local_b8 = auVar10[0];
  uStack_b7 = auVar10[1];
  uStack_b6 = auVar10[2];
  uStack_b5 = auVar10[3];
  uStack_b4 = auVar10[4];
  uStack_b3 = auVar10[5];
  uStack_b2 = auVar10[6];
  uStack_b1 = auVar10[7];
  uStack_b0 = auVar10[8];
  uStack_af = auVar10[9];
  uStack_ae = auVar10[10];
  uStack_ad = auVar10[0xb];
  uStack_ac = auVar10[0xc];
  uStack_ab = auVar10[0xd];
  uStack_aa = auVar10[0xe];
  uStack_a9 = auVar10[0xf];
  pavgb(local_b8,local_78);
  pavgb(uStack_b7,uStack_77);
  pavgb(uStack_b6,uStack_76);
  pavgb(uStack_b5,uStack_75);
  uVar9 = pavgb(uStack_b4,uStack_74);
  uVar11 = pavgb(uStack_b3,uStack_73);
  uVar12 = pavgb(uStack_b2,uStack_72);
  uVar13 = pavgb(uStack_b1,uStack_71);
  uVar14 = pavgb(uStack_b0,0);
  uVar15 = pavgb(uStack_af,0);
  uVar16 = pavgb(uStack_ae,0);
  uVar17 = pavgb(uStack_ad,0);
  uVar18 = pavgb(uStack_ac,0);
  uVar19 = pavgb(uStack_ab,0);
  uVar20 = pavgb(uStack_aa,0);
  uVar21 = pavgb(uStack_a9,0);
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar21,CONCAT16(uVar20,CONCAT15(uVar19,CONCAT14(uVar18,CONCAT13(uVar17,
                                                  CONCAT12(uVar16,CONCAT11(uVar15,uVar14))))))),
                 CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar9))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar21,CONCAT16(uVar20,CONCAT15(uVar19,CONCAT14(uVar18,CONCAT13(uVar17,
                                                  CONCAT12(uVar16,CONCAT11(uVar15,uVar14))))))),
                 CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar9))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar21,CONCAT16(uVar20,CONCAT15(uVar19,CONCAT14(uVar18,CONCAT13(uVar17,
                                                  CONCAT12(uVar16,CONCAT11(uVar15,uVar14))))))),
                 CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar9))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar21,CONCAT16(uVar20,CONCAT15(uVar19,CONCAT14(uVar18,CONCAT13(uVar17,
                                                  CONCAT12(uVar16,CONCAT11(uVar15,uVar14))))))),
                 CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar9))));
  *(char *)(in_RDI + 0x40) = (char)((int)((uint)bVar2 + uVar8 * 2 + (uint)bVar4 + 2) >> 2);
  *(char *)(in_RDI + 0x60) = (char)((int)((uint)bVar3 + (uint)bVar2 * 2 + uVar8 + 2) >> 2);
  return;
}

Assistant:

static WEBP_INLINE void VR4_SSE2(uint8_t* WEBP_RESTRICT dst,
                                 const uint8_t* WEBP_RESTRICT top) {
  const __m128i one = _mm_set1_epi8(1);
  const int I = top[-2];
  const int J = top[-3];
  const int K = top[-4];
  const int X = top[-1];
  const __m128i XABCD = _mm_loadl_epi64((const __m128i*)(top - 1));
  const __m128i ABCD0 = _mm_srli_si128(XABCD, 1);
  const __m128i abcd = _mm_avg_epu8(XABCD, ABCD0);
  const __m128i _XABCD = _mm_slli_si128(XABCD, 1);
  const __m128i IXABCD = _mm_insert_epi16(_XABCD, (short)(I | (X << 8)), 0);
  const __m128i avg1 = _mm_avg_epu8(IXABCD, ABCD0);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(IXABCD, ABCD0), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i efgh = _mm_avg_epu8(avg2, XABCD);
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               abcd    ));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(               efgh    ));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_slli_si128(abcd, 1)));
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_slli_si128(efgh, 1)));

  // these two are hard to implement in SSE2, so we keep the C-version:
  DST(0, 2) = AVG3(J, I, X);
  DST(0, 3) = AVG3(K, J, I);
}